

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

void __thiscall helics::FederateState::generateProfilingMarker(FederateState *this)

{
  BaseType BVar1;
  long lVar2;
  baseType bVar3;
  undefined8 uVar4;
  string *psVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  string_view logMessageSource;
  format_args args;
  string_view message_00;
  string message;
  ActionMessage prof;
  
  bVar3 = std::chrono::_V2::steady_clock::now();
  uVar4 = std::chrono::_V2::system_clock::now();
  BVar1 = (this->global_id)._M_i.gid;
  psVar5 = fedStateString_abi_cxx11_((this->state)._M_i);
  lVar2 = (this->time_granted).internalTimeCode;
  prof.payload.buffer._M_elems._16_8_ =
       (double)(lVar2 % 1000000000) * 1e-09 + (double)(lVar2 / 1000000000);
  prof._0_8_ = (this->name)._M_dataplus._M_p;
  prof._8_8_ = (this->name)._M_string_length;
  prof.actionTime.internalTimeCode = (baseType)(psVar5->_M_dataplus)._M_p;
  prof.Te.internalTimeCode = psVar5->_M_string_length;
  fmt.size_ = 0xa33d1d;
  fmt.data_ = (char *)0x34;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&prof;
  prof.dest_id.gid = BVar1;
  prof.Tdemin.internalTimeCode = bVar3;
  prof.payload.buffer._M_elems._0_8_ = uVar4;
  ::fmt::v11::vformat_abi_cxx11_
            (&message,(v11 *)"<PROFILING>{}[{}]({})MARKER<{}|{}>[t={}]</PROFILING>",fmt,args);
  if (this->mLocalProfileCapture == true) {
    logMessageSource._M_str = (this->name)._M_dataplus._M_p;
    logMessageSource._M_len = (this->name)._M_string_length;
    message_00._M_str = message._M_dataplus._M_p;
    message_00._M_len = message._M_string_length;
    logMessage(this,2,logMessageSource,message_00,false);
  }
  else if (this->mParent != (CommonCore *)0x0) {
    ActionMessage::ActionMessage
              (&prof,cmd_profiler_data,(GlobalFederateId)(this->global_id)._M_i.gid,
               (GlobalFederateId)0x0);
    SmallBuffer::operator=(&prof.payload,&message);
    BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&prof);
    ActionMessage::~ActionMessage(&prof);
  }
  std::__cxx11::string::~string((string *)&message);
  return;
}

Assistant:

void FederateState::generateProfilingMarker()
{
    auto ctime = std::chrono::steady_clock::now();
    auto gtime = std::chrono::system_clock::now();
    const std::string message = fmt::format(
        "<PROFILING>{}[{}]({})MARKER<{}|{}>[t={}]</PROFILING>",
        name,
        global_id.load().baseValue(),
        fedStateString(getState()),
        std::chrono::duration_cast<std::chrono::nanoseconds>(ctime.time_since_epoch()).count(),
        std::chrono::duration_cast<std::chrono::nanoseconds>(gtime.time_since_epoch()).count(),
        static_cast<double>(time_granted));

    if (mLocalProfileCapture) {
        logMessage(HELICS_LOG_LEVEL_PROFILING, name, message);
    } else {
        if (mParent != nullptr) {
            ActionMessage prof(CMD_PROFILER_DATA, global_id.load(), parent_broker_id);
            prof.payload = message;
            mParent->addActionMessage(std::move(prof));
        }
    }
}